

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

AActor * P_LineAttack(AActor *t1,DAngle *angle,double distance,DAngle *pitch,int damage,
                     FName *damageType,PClassActor *pufftype,int flags,FTranslatedLineTarget *victim
                     ,int *actualdamage)

{
  int duration;
  int period;
  sector_t_conflict *sector;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  PClassActor *type;
  Self *pSVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int local_4bc;
  int local_49c;
  bool local_48c;
  bool local_48b;
  bool local_48a;
  AActor *local_470;
  AActor *local_428;
  bool local_39e;
  bool local_39d;
  bool local_39c;
  bool local_39b;
  bool local_39a;
  bool local_399;
  TAngle<double> local_360;
  TAngle<double> local_358;
  undefined1 local_350 [44];
  undefined1 local_324 [4];
  TFlags<ActorFlag2,_unsigned_int> local_320;
  TFlags<ActorFlag,_unsigned_int> local_31c;
  TAngle<double> local_318;
  undefined1 local_30c [4];
  TFlags<ActorFlag2,_unsigned_int> local_308;
  TFlags<ActorFlag,_unsigned_int> local_304;
  bool local_2fd;
  TFlags<ActorFlag5,_unsigned_int> local_2fc;
  bool axeBlood;
  TFlags<ActorFlag3,_unsigned_int> local_2f4;
  bool bloodsplatter;
  FName local_2e4;
  TAngle<double> local_2e0;
  TAngle<double> local_2d8;
  TFlags<ActorFlag5,_unsigned_int> local_2d0;
  uint local_2cc;
  TFlags<ActorFlag7,_unsigned_int> local_2c8;
  int dmgflags;
  int local_2c0;
  FName local_2bc;
  int newdam;
  TAngle<double> local_2b0;
  TFlags<ActorFlag,_unsigned_int> local_2a4;
  undefined1 local_2a0 [4];
  TFlags<ActorFlag2,_unsigned_int> local_29c;
  TFlags<ActorFlag,_unsigned_int> local_298;
  TFlags<ActorFlag3,_unsigned_int> local_294;
  Angle local_290;
  DVector2 ofs;
  DVector3 bleedpos;
  TAngle<double> local_260;
  TAngle<double> local_258;
  TVector3<double> local_250;
  undefined1 local_238 [8];
  DVector2 pos;
  TAngle<double> local_220;
  TFlags<ActorFlag3,_unsigned_int> local_214;
  FSoundID local_210;
  TFlags<ActorFlag,_unsigned_int> local_20c;
  DVector3 local_208;
  TFlags<ActorFlag6,_unsigned_int> local_1ec;
  DWORD local_1e8;
  undefined1 local_1e4 [4];
  int tflags;
  AActor *local_1c8;
  AActor *tempuff;
  TFlags<ActorFlag6,_unsigned_int> local_1b8;
  TFlags<ActorFlag7,_unsigned_int> local_1b4;
  TFlags<ActorFlag6,_unsigned_int> local_1b0;
  TFlags<ActorFlag3,_unsigned_int> local_1ac;
  TFlags<ActorFlag2,_unsigned_int> local_1a8;
  TFlags<ActorFlag2,_unsigned_int> local_1a4;
  AActor *local_1a0;
  AActor *puffDefaults;
  double local_180;
  double pc;
  uint local_170;
  uint uStack_16c;
  bool spawnSky;
  int puffFlags;
  int pflag;
  AActor *puff;
  undefined1 auStack_158 [7];
  bool killPuff;
  Origin TData;
  FTraceResults trace;
  double shootz;
  DVector3 direction;
  bool nointeract;
  PClassActor *pufftype_local;
  FName *damageType_local;
  int damage_local;
  DAngle *pitch_local;
  double distance_local;
  DAngle *angle_local;
  AActor *t1_local;
  
  direction.Z._7_1_ = (flags & 8U) != 0;
  TVector3<double>::TVector3((TVector3<double> *)&shootz);
  FTraceResults::FTraceResults((FTraceResults *)&TData.PuffSpecies);
  Origin::Origin((Origin *)auStack_158);
  puff._7_1_ = 0;
  _puffFlags = (AActor *)0x0;
  uStack_16c = 0;
  local_170 = 0;
  if ((flags & 1U) != 0) {
    local_170 = 2;
  }
  pc._7_1_ = 0;
  if ((flags & 2U) != 0) {
    local_170 = local_170 | 0x10;
  }
  _auStack_158 = t1;
  if (victim != (FTranslatedLineTarget *)0x0) {
    memset(victim,0,0x20);
  }
  if (actualdamage != (int *)0x0) {
    *actualdamage = 0;
  }
  dVar6 = TAngle<double>::Cos(pitch);
  local_180 = dVar6;
  dVar7 = TAngle<double>::Cos(angle);
  dVar10 = local_180;
  dVar8 = TAngle<double>::Sin(angle);
  dVar9 = TAngle<double>::Sin(pitch);
  TVector3<double>::TVector3((TVector3<double> *)&puffDefaults,dVar6 * dVar7,dVar10 * dVar8,-dVar9);
  TVector3<double>::operator=((TVector3<double> *)&shootz,(TVector3<double> *)&puffDefaults);
  dVar10 = AActor::Center(t1);
  dVar10 = dVar10 - t1->Floorclip;
  if (t1->player == (player_t *)0x0) {
    trace.Crossed3DWaterPos.Z = dVar10 + 8.0;
  }
  else {
    trace.Crossed3DWaterPos.Z = t1->player->mo->AttackZOffset * t1->player->crouchfactor + dVar10;
    bVar1 = FName::operator==(damageType,NAME_Melee);
    if ((bVar1) || (bVar1 = FName::operator==(damageType,NAME_Hitscan), bVar1)) {
      uStack_16c = 0x20;
    }
  }
  type = PClassActor::GetReplacement(pufftype,true);
  local_1a0 = GetDefaultByType(&type->super_PClass);
  if ((t1->player == (player_t *)0x0) || (t1->player->ReadyWeapon == (AWeapon *)0x0)) {
LAB_0058912d:
    local_39a = false;
    if (local_1a0 != (AActor *)0x0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_1a8,(int)local_1a0 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1a8);
      local_39a = uVar3 != 0;
    }
    local_399 = local_39a;
  }
  else {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_1a4,(int)t1->player->ReadyWeapon + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1a4);
    local_399 = true;
    if (uVar3 == 0) goto LAB_0058912d;
  }
  TData.Caller._4_1_ = local_399;
  local_39b = false;
  if (local_1a0 != (AActor *)0x0) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_1ac,
               (int)local_1a0 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1ac);
    local_39b = uVar3 != 0;
  }
  pc._7_1_ = local_39b;
  local_39c = false;
  if (local_1a0 != (AActor *)0x0) {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_1b0,
               (int)local_1a0 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1b0);
    local_39c = uVar3 != 0;
  }
  TData.Caller._5_1_ = local_39c;
  FNameNoInit::operator=((FNameNoInit *)&TData,NAME_None);
  TFlags<ActorFlag7,_unsigned_int>::operator&
            (&local_1b4,
             (int)local_1a0 +
             (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1b4);
  if (uVar3 == 0) {
    TData.Caller._6_1_ = 0;
    TData.Caller._7_1_ = 0;
  }
  else {
    local_39d = false;
    if (local_1a0 != (AActor *)0x0) {
      TFlags<ActorFlag6,_unsigned_int>::operator&
                (&local_1b8,
                 (int)local_1a0 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1b8);
      local_39d = uVar3 != 0;
    }
    TData.Caller._6_1_ = local_39d;
    local_39e = false;
    if (local_1a0 != (AActor *)0x0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                ((TFlags<ActorFlag2,_unsigned_int> *)((long)&tempuff + 4),
                 (int)local_1a0 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&tempuff + 4));
      local_39e = uVar3 != 0;
    }
    TData.Caller._7_1_ = local_39e;
    local_1c8 = (AActor *)0x0;
    if (pufftype != (PClassActor *)0x0) {
      AActor::Pos((DVector3 *)&tflags,t1);
      local_1c8 = Spawn(pufftype,(DVector3 *)&tflags,ALLOW_REPLACE);
    }
    if (local_1c8 != (AActor *)0x0) {
      AActor::GetSpecies((AActor *)local_1e4);
      FNameNoInit::operator=((FNameNoInit *)&TData,(FName *)local_1e4);
      (*(local_1c8->super_DThinker).super_DObject._vptr_DObject[4])();
    }
  }
  bVar1 = FName::operator==(damageType,NAME_None);
  if ((((bVar1) || (bVar1 = FName::operator==(damageType,NAME_Melee), bVar1)) ||
      (bVar1 = FName::operator==(damageType,NAME_Hitscan), bVar1)) &&
     ((local_1a0 != (AActor *)0x0 &&
      (bVar1 = FName::operator!=(&(local_1a0->DamageType).super_FName,NAME_None), bVar1)))) {
    FName::operator=(damageType,&(local_1a0->DamageType).super_FName);
  }
  bVar1 = true;
  if (((direction.Z._7_1_ & 1) == 0) && (bVar1 = false, local_1a0 != (AActor *)0x0)) {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_1ec,
               (int)local_1a0 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1ec);
    bVar1 = uVar3 != 0;
  }
  if (bVar1) {
    local_1e8 = 1;
  }
  else {
    local_1e8 = 5;
  }
  AActor::PosAtZ(&local_208,t1,trace.Crossed3DWaterPos.Z);
  sector = (sector_t_conflict *)t1->Sector;
  TFlags<ActorFlag,_unsigned_int>::TFlags(&local_20c,MF_SHOOTABLE);
  bVar1 = Trace(&local_208,sector,(DVector3 *)&shootz,distance,&local_20c,0x8008000,t1,
                (FTraceResults *)&TData.PuffSpecies,local_1e8,CheckForActor,auStack_158);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    if ((((direction.Z._7_1_ & 1) == 0) && (local_1a0 != (AActor *)0x0)) &&
       (iVar4 = FSoundID::operator_cast_to_int(&(local_1a0->ActiveSound).super_FSoundID), iVar4 != 0
       )) {
      FSoundID::FSoundID(&local_210,&(local_1a0->ActiveSound).super_FSoundID);
      S_Sound(t1,1,&local_210,1.0,1.0);
    }
    bVar1 = true;
    if (((direction.Z._7_1_ & 1) == 0) && (bVar1 = false, local_1a0 != (AActor *)0x0)) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_214,
                 (int)local_1a0 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_214);
      bVar1 = uVar3 != 0;
    }
    if (!bVar1) {
      return (AActor *)0x0;
    }
    TAngle<double>::TAngle(&local_220,(TAngle<double> *)&trace.SrcFromTarget.Z);
    TAngle<double>::TAngle((TAngle<double> *)&pos.Y,(TAngle<double> *)&trace.SrcFromTarget.Z);
    _puffFlags = P_SpawnPuff(t1,pufftype,(DVector3 *)&trace.HitTexture,&local_220,(DAngle *)&pos.Y,2
                             ,local_170,(AActor *)0x0);
    if ((direction.Z._7_1_ & 1) != 0) {
      return _puffFlags;
    }
    goto LAB_0058a7a6;
  }
  if (trace.Line._4_4_ == 4) {
    TVector3<double>::TVector3((TVector3<double> *)&ofs.Y,(TVector3<double> *)&trace.HitTexture);
    if ((i_compatflags & 0x10000000U) != 0) {
      P_GetOffsetPosition(ofs.Y,bleedpos.X,trace.HitPos.Z * -10.0,trace.HitVector.X * -10.0);
      ofs.Y = local_290.Degrees;
      bleedpos.X = ofs.X;
      bleedpos.Y = bleedpos.Y - trace.HitVector.Y * -10.0;
    }
    bVar1 = true;
    if ((direction.Z._7_1_ & 1) == 0) {
      if (local_1a0 != (AActor *)0x0) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_294,
                   (int)local_1a0 +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_294);
        bVar1 = true;
        if (uVar3 != 0) goto LAB_00589c92;
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_298,
                 SUB84(trace.Fraction,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_298);
      bVar1 = true;
      if (uVar3 == 0) {
        pSVar5 = (Self *)((long)trace.Fraction + 0x1c0);
        operator|((EnumType)local_2a0,MF2_INVULNERABLE);
        TFlags<ActorFlag2,_unsigned_int>::operator&(&local_29c,pSVar5);
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_29c);
        bVar1 = uVar3 != 0;
      }
    }
LAB_00589c92:
    if (bVar1) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_2a4,
                 SUB84(trace.Fraction,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2a4);
      if (uVar3 == 0) {
        local_170 = local_170 | 8;
      }
      TAngle<double>::TAngle(&local_2b0,(TAngle<double> *)&trace.SrcFromTarget.Z);
      TAngle<double>::operator-((TAngle<double> *)&newdam,90.0);
      _puffFlags = P_SpawnPuff(t1,pufftype,(DVector3 *)&ofs.Y,&local_2b0,(DAngle *)&newdam,2,
                               local_170 | 1,(AActor *)trace.Fraction);
      if ((direction.Z._7_1_ & 1) != 0) {
        return _puffFlags;
      }
    }
    dVar10 = trace.Fraction;
    if (((local_1a0 != (AActor *)0x0) && (0 < local_1a0->PoisonDamage)) &&
       (local_1a0->PoisonDuration != -0x80000000)) {
      local_428 = t1;
      if (_puffFlags != (AActor *)0x0) {
        local_428 = _puffFlags;
      }
      iVar4 = local_1a0->PoisonDamage;
      duration = local_1a0->PoisonDuration;
      period = local_1a0->PoisonPeriod;
      FName::FName(&local_2bc,&(local_1a0->PoisonDamageType).super_FName);
      P_PoisonMobj((AActor *)dVar10,local_428,t1,iVar4,duration,period,&local_2bc);
    }
    bVar1 = true;
    local_2c0 = damage;
    if ((damage == 0) && (bVar1 = false, local_1a0 != (AActor *)0x0)) {
      TFlags<ActorFlag6,_unsigned_int>::operator&
                ((TFlags<ActorFlag6,_unsigned_int> *)&dmgflags,
                 (int)local_1a0 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&dmgflags);
      bVar1 = true;
      if (uVar3 == 0) {
        TFlags<ActorFlag7,_unsigned_int>::operator&
                  (&local_2c8,
                   (int)local_1a0 +
                   (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c8);
        bVar1 = uVar3 != 0;
      }
    }
    if (bVar1) {
      local_2cc = uStack_16c | 2;
      bVar1 = false;
      if (((t1->player != (player_t *)0x0) && (bVar1 = false, (uStack_16c & 0x20) != 0)) &&
         (bVar1 = false, t1->player->ReadyWeapon != (AWeapon *)0x0)) {
        TFlags<ActorFlag5,_unsigned_int>::operator&
                  (&local_2d0,
                   (int)t1->player->ReadyWeapon +
                   (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2d0);
        bVar1 = uVar3 != 0;
      }
      if (bVar1) {
        local_2cc = local_2cc | 1;
      }
      if (_puffFlags == (AActor *)0x0) {
        TAngle<double>::TAngle(&local_2d8,0.0);
        TAngle<double>::TAngle(&local_2e0,0.0);
        _puffFlags = P_SpawnPuff(t1,pufftype,(DVector3 *)&ofs.Y,&local_2d8,&local_2e0,2,
                                 local_170 | 5,(AActor *)0x0);
        puff._7_1_ = 1;
      }
      dVar10 = trace.Fraction;
      local_470 = t1;
      if (_puffFlags != (AActor *)0x0) {
        local_470 = _puffFlags;
      }
      FName::FName(&local_2e4,damageType);
      uVar3 = local_2cc | 0x200;
      TAngle<double>::TAngle
                ((TAngle<double> *)&stack0xfffffffffffffd10,(TAngle<double> *)&trace.SrcFromTarget.Z
                );
      local_2c0 = P_DamageMobj((AActor *)dVar10,local_470,t1,damage,&local_2e4,uVar3,
                               (DAngle *)&stack0xfffffffffffffd10);
      if (actualdamage != (int *)0x0) {
        *actualdamage = local_2c0;
      }
    }
    bVar1 = false;
    if (local_1a0 != (AActor *)0x0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_2f4,
                 (int)local_1a0 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2f4);
      bVar1 = uVar3 != 0;
    }
    if (!bVar1) {
      TFlags<ActorFlag5,_unsigned_int>::operator&
                (&local_2fc,
                 (int)t1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|
                           MF5_NODROPOFF));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2fc);
      local_48a = true;
      if (uVar3 == 0) {
        local_48b = false;
        if ((t1->player != (player_t *)0x0) &&
           (local_48b = false, t1->player->ReadyWeapon != (AWeapon *)0x0)) {
          local_48b = (*(uint *)&(t1->player->ReadyWeapon->super_AStateProvider).super_AInventory.
                                 field_0x4fc & 8) != 0;
        }
        local_48a = local_48b;
      }
      axeBlood = local_48a;
      local_48c = false;
      if ((t1->player != (player_t *)0x0) &&
         (local_48c = false, t1->player->ReadyWeapon != (AWeapon *)0x0)) {
        local_48c = (*(uint *)&(t1->player->ReadyWeapon->super_AStateProvider).super_AInventory.
                               field_0x4fc & 8) != 0;
      }
      local_2fd = local_48c;
      bVar1 = false;
      if ((local_48a == false) && (bVar1 = false, local_48c == false)) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_304,
                   SUB84(trace.Fraction,0) +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_304);
        bVar1 = false;
        if (uVar3 == 0) {
          pSVar5 = (Self *)((long)trace.Fraction + 0x1c0);
          operator|((EnumType)local_30c,MF2_INVULNERABLE);
          TFlags<ActorFlag2,_unsigned_int>::operator&(&local_308,pSVar5);
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_308);
          bVar1 = uVar3 == 0;
        }
      }
      if (bVar1) {
        TAngle<double>::TAngle(&local_318,(TAngle<double> *)&trace.SrcFromTarget.Z);
        local_49c = damage;
        if (0 < local_2c0) {
          local_49c = local_2c0;
        }
        P_SpawnBlood((DVector3 *)&ofs.Y,&local_318,local_49c,(AActor *)trace.Fraction);
      }
      if (damage != 0) {
        if (((axeBlood & 1U) != 0) || ((local_2fd & 1U) != 0)) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_31c,
                     SUB84(trace.Fraction,0) +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_31c);
          bVar1 = false;
          if (uVar3 == 0) {
            pSVar5 = (Self *)((long)trace.Fraction + 0x1c0);
            operator|((EnumType)local_324,MF2_INVULNERABLE);
            TFlags<ActorFlag2,_unsigned_int>::operator&(&local_320,pSVar5);
            uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_320);
            bVar1 = uVar3 == 0;
          }
          dVar10 = trace.Fraction;
          if (bVar1) {
            if ((local_2fd & 1U) != 0) {
              TAngle<double>::TAngle
                        ((TAngle<double> *)(local_350 + 0x20),
                         (TAngle<double> *)&trace.SrcFromTarget.Z);
              P_BloodSplatter2((DVector3 *)&ofs.Y,(AActor *)dVar10,(DAngle *)(local_350 + 0x20));
            }
            iVar4 = FRandom::operator()(&pr_lineattack);
            dVar10 = trace.Fraction;
            if (iVar4 < 0xc0) {
              TAngle<double>::TAngle
                        ((TAngle<double> *)(local_350 + 0x18),
                         (TAngle<double> *)&trace.SrcFromTarget.Z);
              P_BloodSplatter((DVector3 *)&ofs.Y,(AActor *)dVar10,(DAngle *)(local_350 + 0x18));
            }
          }
        }
        dVar10 = trace.Fraction;
        local_4bc = damage;
        if (0 < local_2c0) {
          local_4bc = local_2c0;
        }
        TAngle<double>::TAngle
                  ((TAngle<double> *)(local_350 + 0x10),(TAngle<double> *)&trace.SrcFromTarget.Z);
        TAngle<double>::TAngle((TAngle<double> *)(local_350 + 8),pitch);
        P_TraceBleed(local_4bc,(DVector3 *)&trace.HitTexture,(AActor *)dVar10,
                     (DAngle *)(local_350 + 0x10),(DAngle *)(local_350 + 8));
      }
    }
    if (victim != (FTranslatedLineTarget *)0x0) {
      victim->linetarget = (AActor *)trace.Fraction;
      TAngle<double>::operator=
                (&victim->attackAngleFromSource,(TAngle<double> *)&trace.SrcFromTarget.Z);
      if ((trace.Line._2_1_ & 1) == 0) {
        AActor::AngleTo((AActor *)local_350,t1,SUB81(trace.Fraction,0));
      }
      else {
        TAngle<double>::TAngle((TAngle<double> *)local_350,&victim->attackAngleFromSource);
      }
      TAngle<double>::operator=(&victim->angleFromSource,(TAngle<double> *)local_350);
      victim->unlinked = (bool)(trace.Line._2_1_ & 1);
    }
  }
  else {
    if (((((direction.Z._7_1_ & 1) != 0) || (trace.Line._4_4_ != 3)) ||
        (*(int *)&((trace.Actor)->super_DThinker).NextThinker != 9)) || ((pc._7_1_ & 1) != 0)) {
      P_GetOffsetPosition((double)trace._8_8_,trace.HitPos.X,-trace.HitPos.Z * 4.0,
                          -trace.HitVector.X * 4.0);
      TVector3<double>::TVector3
                (&local_250,(Vector2 *)local_238,trace.HitPos.Y - trace.HitVector.Y * 4.0);
      TAngle<double>::TAngle(&local_258,(TAngle<double> *)&trace.SrcFromTarget.Z);
      TAngle<double>::operator-(&local_260,90.0);
      _puffFlags = P_SpawnPuff(t1,pufftype,&local_250,&local_258,&local_260,0,local_170,
                               (AActor *)0x0);
      _puffFlags->radius = 1.52587890625e-05;
      if ((direction.Z._7_1_ & 1) != 0) {
        return _puffFlags;
      }
    }
    bVar1 = false;
    if ((trace.Line._4_4_ == 3) &&
       (bVar1 = false, *(int *)&((trace.Actor)->super_DThinker).NextThinker != 9)) {
      bVar2 = line_t::isVisualPortal((line_t *)trace.Actor);
      bVar1 = false;
      if ((!bVar2) && (bVar1 = false, (flags & 4U) == 0)) {
        TFlags<ActorFlag7,_unsigned_int>::operator&
                  ((TFlags<ActorFlag7,_unsigned_int> *)((long)&bleedpos.Z + 4),
                   (int)local_1a0 +
                   (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&bleedpos.Z + 4));
        bVar1 = uVar3 == 0;
      }
    }
    if (bVar1) {
      if ((t1->DecalGenerator == (FDecalBase *)0x0) &&
         (((t1->player == (player_t *)0x0 || (t1->player->ReadyWeapon == (AWeapon *)0x0)) ||
          ((t1->player->ReadyWeapon->super_AStateProvider).super_AInventory.super_AActor.
           DecalGenerator == (FDecalBase *)0x0)))) {
        if ((_puffFlags == (AActor *)0x0) || (_puffFlags->DecalGenerator == (FDecalBase *)0x0)) {
          SpawnShootDecal(t1,(FTraceResults *)&TData.PuffSpecies);
        }
        else {
          SpawnShootDecal(_puffFlags,(FTraceResults *)&TData.PuffSpecies);
        }
      }
      else {
        TFlags<ActorFlag7,_unsigned_int>::operator&
                  ((TFlags<ActorFlag7,_unsigned_int> *)&bleedpos.Z,
                   (int)local_1a0 +
                   (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&bleedpos.Z);
        bVar1 = false;
        if ((uVar3 != 0) && (bVar1 = false, _puffFlags != (AActor *)0x0)) {
          bVar1 = _puffFlags->DecalGenerator != (FDecalBase *)0x0;
        }
        if (bVar1) {
          SpawnShootDecal(_puffFlags,(FTraceResults *)&TData.PuffSpecies);
        }
        else {
          SpawnShootDecal(t1,(FTraceResults *)&TData.PuffSpecies);
        }
      }
    }
    else if ((((_puffFlags != (AActor *)0x0) && (trace.ffloor == (F3DFloor *)0x0)) &&
             (*(long *)(TData._8_8_ + 0x1a8) == 0)) && (trace.Line._4_4_ == 1)) {
      P_HitWater(_puffFlags,(sector_t *)TData._8_8_,(DVector3 *)&trace.HitTexture,false,true,false);
    }
  }
  if ((trace.CrossedWaterPos.Z != 0.0) || (trace.ffloor != (F3DFloor *)0x0)) {
    if (_puffFlags == (AActor *)0x0) {
      TAngle<double>::TAngle(&local_358,0.0);
      TAngle<double>::TAngle(&local_360,0.0);
      _puffFlags = P_SpawnPuff(t1,pufftype,(DVector3 *)&trace.HitTexture,&local_358,&local_360,2,
                               local_170 | 5,(AActor *)0x0);
      puff._7_1_ = 1;
    }
    SpawnDeepSplash(t1,(FTraceResults *)&TData.PuffSpecies,_puffFlags);
  }
LAB_0058a7a6:
  if (((puff._7_1_ & 1) != 0) && (_puffFlags != (AActor *)0x0)) {
    (*(_puffFlags->super_DThinker).super_DObject._vptr_DObject[4])();
    _puffFlags = (AActor *)0x0;
  }
  return _puffFlags;
}

Assistant:

AActor *P_LineAttack(AActor *t1, DAngle angle, double distance,
	DAngle pitch, int damage, FName damageType, PClassActor *pufftype, int flags, FTranslatedLineTarget*victim, int *actualdamage)
{
	bool nointeract = !!(flags & LAF_NOINTERACT);
	DVector3 direction;
	double shootz;
	FTraceResults trace;
	Origin TData;
	TData.Caller = t1;
	bool killPuff = false;
	AActor *puff = NULL;
	int pflag = 0;
	int puffFlags = (flags & LAF_ISMELEEATTACK) ? PF_MELEERANGE : 0;
	bool spawnSky = false;
	if (flags & LAF_NORANDOMPUFFZ)
		puffFlags |= PF_NORANDOMZ;

	if (victim != NULL)
	{
		memset(victim, 0, sizeof(*victim));
	}
	if (actualdamage != NULL)
	{
		*actualdamage = 0;
	}

	double pc = pitch.Cos();

	direction = { pc * angle.Cos(), pc * angle.Sin(), -pitch.Sin() };
	shootz = t1->Center() - t1->Floorclip;

	if (t1->player != NULL)
	{
		shootz += t1->player->mo->AttackZOffset * t1->player->crouchfactor;
		if (damageType == NAME_Melee || damageType == NAME_Hitscan)
		{
			// this is coming from a weapon attack function which needs to transfer information to the obituary code,
			// We need to preserve this info from the damage type because the actual damage type can get overridden by the puff
			pflag = DMG_PLAYERATTACK;
		}
	}
	else
	{
		shootz += 8;
	}

	// We need to check the defaults of the replacement here
	AActor *puffDefaults = GetDefaultByType(pufftype->GetReplacement());
	
	TData.hitGhosts = (t1->player != NULL &&
		t1->player->ReadyWeapon != NULL &&
		(t1->player->ReadyWeapon->flags2 & MF2_THRUGHOST)) ||
		(puffDefaults && (puffDefaults->flags2 & MF2_THRUGHOST));
	
	spawnSky = (puffDefaults && (puffDefaults->flags3 & MF3_SKYEXPLODE));
	TData.MThruSpecies = (puffDefaults && (puffDefaults->flags6 & MF6_MTHRUSPECIES));
	TData.PuffSpecies = NAME_None;

	// [MC] To prevent possible mod breakage, this flag is pretty much necessary.
	// Somewhere, someone is relying on these to spawn on actors and move through them.

	if ((puffDefaults->flags7 & MF7_ALLOWTHRUFLAGS))
	{
		TData.ThruSpecies = (puffDefaults && (puffDefaults->flags6 & MF6_THRUSPECIES));
		TData.ThruActors = (puffDefaults && (puffDefaults->flags2 & MF2_THRUACTORS));

		// [MC] Because this is a one-hit trace event, we need to spawn the puff, get the species
		// and destroy it. Assume there is no species unless tempuff isn't NULL. We cannot get
		// a proper species the same way as puffDefaults flags it appears...

		AActor *tempuff = NULL;
		if (pufftype != NULL)
			tempuff = Spawn(pufftype, t1->Pos(), ALLOW_REPLACE);
		if (tempuff != NULL)
		{
			TData.PuffSpecies = tempuff->GetSpecies();
			tempuff->Destroy();
		}
	}
	else
	{
		TData.ThruSpecies = false;
		TData.ThruActors = false;
	}
	// if the puff uses a non-standard damage type, this will override default, hitscan and melee damage type.
	// All other explicitly passed damage types (currenty only MDK) will be preserved.
	if ((damageType == NAME_None || damageType == NAME_Melee || damageType == NAME_Hitscan) &&
		puffDefaults != NULL && puffDefaults->DamageType != NAME_None)
	{
		damageType = puffDefaults->DamageType;
	}

	int tflags;
	if (nointeract || (puffDefaults && puffDefaults->flags6 & MF6_NOTRIGGER)) tflags = TRACE_NoSky;
	else tflags = TRACE_NoSky | TRACE_Impact;

	if (!Trace(t1->PosAtZ(shootz), t1->Sector, direction, distance, MF_SHOOTABLE, 
		ML_BLOCKEVERYTHING | ML_BLOCKHITSCAN, t1, trace, tflags, CheckForActor, &TData))
	{ // hit nothing
		if (!nointeract && puffDefaults && puffDefaults->ActiveSound)
		{ // Play miss sound
			S_Sound(t1, CHAN_WEAPON, puffDefaults->ActiveSound, 1, ATTN_NORM);
		}

		// [MC] LAF_NOINTERACT guarantees puff spawning and returns it directly to the calling function.
		// No damage caused, no sounds played, no blood splatters.

		if (nointeract || (puffDefaults && puffDefaults->flags3 & MF3_ALWAYSPUFF))
		{ // Spawn the puff anyway
			puff = P_SpawnPuff(t1, pufftype, trace.HitPos, trace.SrcAngleFromTarget, trace.SrcAngleFromTarget, 2, puffFlags);

			if (nointeract)
			{
				return puff;
			}
		}
		else
		{
			return nullptr;
		}
	}
	else
	{
		if (trace.HitType != TRACE_HitActor)
		{
			// position a bit closer for puffs
			if (nointeract || trace.HitType != TRACE_HitWall || ((trace.Line->special != Line_Horizon) || spawnSky))
			{
				DVector2 pos = P_GetOffsetPosition(trace.HitPos.X, trace.HitPos.Y, -trace.HitVector.X * 4, -trace.HitVector.Y * 4);
				puff = P_SpawnPuff(t1, pufftype, DVector3(pos, trace.HitPos.Z - trace.HitVector.Z * 4), trace.SrcAngleFromTarget,
					trace.SrcAngleFromTarget - 90, 0, puffFlags);
				puff->radius = 1/65536.;

				if (nointeract)
				{
					return puff;
				}
			}

			// [RH] Spawn a decal
			if (trace.HitType == TRACE_HitWall && trace.Line->special != Line_Horizon && !trace.Line->isVisualPortal() && !(flags & LAF_NOIMPACTDECAL) && !(puffDefaults->flags7 & MF7_NODECAL))
			{
				// [TN] If the actor or weapon has a decal defined, use that one.
				if (t1->DecalGenerator != NULL ||
					(t1->player != NULL && t1->player->ReadyWeapon != NULL && t1->player->ReadyWeapon->DecalGenerator != NULL))
				{
					// [ZK] If puff has FORCEDECAL set, do not use the weapon's decal
					if (puffDefaults->flags7 & MF7_FORCEDECAL && puff != NULL && puff->DecalGenerator)
						SpawnShootDecal(puff, trace);
					else
						SpawnShootDecal(t1, trace);
				}

				// Else, look if the bulletpuff has a decal defined.
				else if (puff != NULL && puff->DecalGenerator)
				{
					SpawnShootDecal(puff, trace);
				}

				else
				{
					SpawnShootDecal(t1, trace);
				}
			}
			else if (puff != NULL &&
				trace.CrossedWater == NULL &&
				trace.Sector->heightsec == NULL &&
				trace.HitType == TRACE_HitFloor)
			{
				P_HitWater(puff, trace.Sector, trace.HitPos);
			}
		}
		else
		{
			// Hit a thing, so it could be either a puff or blood
			DVector3 bleedpos = trace.HitPos;
			// position a bit closer for puffs/blood if using compatibility mode.
			if (i_compatflags & COMPATF_HITSCAN)
			{
				DVector2 ofs = P_GetOffsetPosition(bleedpos.X, bleedpos.Y, -10 * trace.HitVector.X, -10 * trace.HitVector.Y);
				bleedpos.X = ofs.X;
				bleedpos.Y = ofs.Y;
				bleedpos.Z -= -10 * trace.HitVector.Z;
			}

			// Spawn bullet puffs or blood spots, depending on target type.
			if (nointeract || (puffDefaults && puffDefaults->flags3 & MF3_PUFFONACTORS) ||
				(trace.Actor->flags & MF_NOBLOOD) ||
				(trace.Actor->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
			{
				if (!(trace.Actor->flags & MF_NOBLOOD))
					puffFlags |= PF_HITTHINGBLEED;

				// We must pass the unreplaced puff type here 
				puff = P_SpawnPuff(t1, pufftype, bleedpos, trace.SrcAngleFromTarget, trace.SrcAngleFromTarget - 90, 2, puffFlags | PF_HITTHING, trace.Actor);

				if (nointeract)
				{
					return puff;
				}
			}

			// Allow puffs to inflict poison damage, so that hitscans can poison, too.
			if (puffDefaults != NULL && puffDefaults->PoisonDamage > 0 && puffDefaults->PoisonDuration != INT_MIN)
			{
				P_PoisonMobj(trace.Actor, puff ? puff : t1, t1, puffDefaults->PoisonDamage, puffDefaults->PoisonDuration, puffDefaults->PoisonPeriod, puffDefaults->PoisonDamageType);
			}

			// [GZ] If MF6_FORCEPAIN is set, we need to call P_DamageMobj even if damage is 0!
			// Note: The puff may not yet be spawned here so we must check the class defaults, not the actor.
			int newdam = damage;
			if (damage || (puffDefaults != NULL && ((puffDefaults->flags6 & MF6_FORCEPAIN) || (puffDefaults->flags7 & MF7_CAUSEPAIN))))
			{
				int dmgflags = DMG_INFLICTOR_IS_PUFF | pflag;
				// Allow MF5_PIERCEARMOR on a weapon as well.
				if (t1->player != NULL && (dmgflags & DMG_PLAYERATTACK) && t1->player->ReadyWeapon != NULL &&
					t1->player->ReadyWeapon->flags5 & MF5_PIERCEARMOR)
				{
					dmgflags |= DMG_NO_ARMOR;
				}
				
				if (puff == NULL)
				{
					// Since the puff is the damage inflictor we need it here 
					// regardless of whether it is displayed or not.
					puff = P_SpawnPuff(t1, pufftype, bleedpos, 0., 0., 2, puffFlags | PF_HITTHING | PF_TEMPORARY);
					killPuff = true;
				}
				newdam = P_DamageMobj(trace.Actor, puff ? puff : t1, t1, damage, damageType, dmgflags|DMG_USEANGLE, trace.SrcAngleFromTarget);
				if (actualdamage != NULL)
				{
					*actualdamage = newdam;
				}
			}
			if (!(puffDefaults != NULL && puffDefaults->flags3&MF3_BLOODLESSIMPACT))
			{
				bool bloodsplatter = (t1->flags5 & MF5_BLOODSPLATTER) ||
					(t1->player != nullptr &&	t1->player->ReadyWeapon != nullptr &&
						(t1->player->ReadyWeapon->WeaponFlags & WIF_AXEBLOOD));

				bool axeBlood = (t1->player != nullptr &&
					t1->player->ReadyWeapon != nullptr &&
					(t1->player->ReadyWeapon->WeaponFlags & WIF_AXEBLOOD));

				if (!bloodsplatter && !axeBlood &&
					!(trace.Actor->flags & MF_NOBLOOD) &&
					!(trace.Actor->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
				{
					P_SpawnBlood(bleedpos, trace.SrcAngleFromTarget, newdam > 0 ? newdam : damage, trace.Actor);
				}

				if (damage)
				{
					if (bloodsplatter || axeBlood)
					{
						if (!(trace.Actor->flags&MF_NOBLOOD) &&
							!(trace.Actor->flags2&(MF2_INVULNERABLE | MF2_DORMANT)))
						{
							if (axeBlood)
							{
								P_BloodSplatter2(bleedpos, trace.Actor, trace.SrcAngleFromTarget);
							}
							if (pr_lineattack() < 192)
							{
								P_BloodSplatter(bleedpos, trace.Actor, trace.SrcAngleFromTarget);
							}
						}
					}
					// [RH] Stick blood to walls
					P_TraceBleed(newdam > 0 ? newdam : damage, trace.HitPos, trace.Actor, trace.SrcAngleFromTarget, pitch);
				}
			}
			if (victim != NULL)
			{
				victim->linetarget = trace.Actor;
				victim->attackAngleFromSource = trace.SrcAngleFromTarget;
				// With arbitrary portals this cannot be calculated so using the actual attack angle is the only option.
				victim->angleFromSource = trace.unlinked? victim->attackAngleFromSource : t1->AngleTo(trace.Actor);
				victim->unlinked = trace.unlinked;
			}
		}
		if (trace.Crossed3DWater || trace.CrossedWater)
		{
			if (puff == NULL)
			{ // Spawn puff just to get a mass for the splash
				puff = P_SpawnPuff(t1, pufftype, trace.HitPos, 0., 0., 2, puffFlags | PF_HITTHING | PF_TEMPORARY);
				killPuff = true;
			}
			SpawnDeepSplash(t1, trace, puff);
		}
	}
	if (killPuff && puff != NULL)
	{
		puff->Destroy();
		puff = NULL;
	}
	return puff;
}